

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

MemoryInstanceInfo * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getMemoryInstanceInfo
          (MemoryInstanceInfo *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          Name name)

{
  long lVar1;
  mapped_type *pmVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  Name NVar6;
  Name NVar7;
  Name NVar8;
  
  pcVar4 = name.super_IString.str._M_str;
  pcVar5 = name.super_IString.str._M_len;
  NVar6.super_IString.str._M_str = pcVar5;
  NVar6.super_IString.str._M_len = (size_t)this->wasm;
  lVar1 = wasm::Module::getMemory(NVar6);
  lVar3 = *(long *)(lVar1 + 0x20);
  while (lVar3 != 0) {
    pmVar2 = std::
             map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
             ::at(&this->linkedInstances,(key_type *)(lVar1 + 0x18));
    NVar7.super_IString.str._M_str = *(char **)(lVar1 + 0x28);
    NVar7.super_IString.str._M_len =
         (size_t)(((pmVar2->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->super_ModuleRunnerBase<wasm::ModuleRunner>).wasm;
    lVar3 = wasm::Module::getExport(NVar7);
    this = &((pmVar2->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_ModuleRunnerBase<wasm::ModuleRunner>;
    pcVar5 = *(char **)(lVar3 + 0x10);
    pcVar4 = *(char **)(lVar3 + 0x18);
    NVar8.super_IString.str._M_str = pcVar5;
    NVar8.super_IString.str._M_len = (size_t)this->wasm;
    lVar1 = wasm::Module::getMemory(NVar8);
    lVar3 = *(long *)(lVar1 + 0x20);
  }
  __return_storage_ptr__->instance = (ModuleRunner *)this;
  (__return_storage_ptr__->name).super_IString.str._M_len = (size_t)pcVar5;
  (__return_storage_ptr__->name).super_IString.str._M_str = pcVar4;
  return __return_storage_ptr__;
}

Assistant:

MemoryInstanceInfo getMemoryInstanceInfo(Name name) {
    auto* memory = wasm.getMemory(name);
    MemoryInstanceInfo memoryInterfaceInfo;
    if (!memory->imported()) {
      return MemoryInstanceInfo{self(), name};
    }

    auto& importedInstance = linkedInstances.at(memory->module);
    auto* memoryExport = importedInstance->wasm.getExport(memory->base);
    return importedInstance->getMemoryInstanceInfo(memoryExport->value);
  }